

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uarrsort.cpp
# Opt level: O3

void uprv_sortArray_63(void *array,int32_t length,int32_t itemSize,UComparator *cmp,void *context,
                      UBool sortStable,UErrorCode *pErrorCode)

{
  void *px;
  undefined1 auStack_1c8 [408];
  
  if (pErrorCode == (UErrorCode *)0x0) {
    return;
  }
  if (U_ZERO_ERROR < *pErrorCode) {
    return;
  }
  if ((((cmp == (UComparator *)0x0) || (itemSize < 1)) || (length < 0)) ||
     (array == (void *)0x0 && 0 < length)) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return;
  }
  if ((uint)length < 2) {
    return;
  }
  if ((uint)length < 9 || sortStable != '\0') {
    if ((uint)itemSize < 0xc9) {
      doInsertionSort((char *)array,length,itemSize,cmp,context,auStack_1c8);
      return;
    }
    px = uprv_malloc_63((ulong)(uint)itemSize);
    if (px == (void *)0x0) {
LAB_002a857b:
      *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
      return;
    }
    doInsertionSort((char *)array,length,itemSize,cmp,context,px);
  }
  else {
    if ((uint)itemSize < 0xc9) {
      subQuickSort((char *)array,0,length,itemSize,cmp,context,auStack_1c8,
                   auStack_1c8 + (uint)itemSize);
      return;
    }
    px = uprv_malloc_63((ulong)(uint)(itemSize * 2));
    if (px == (void *)0x0) goto LAB_002a857b;
    subQuickSort((char *)array,0,length,itemSize,cmp,context,px,
                 (void *)((ulong)(uint)itemSize + (long)px));
  }
  uprv_free_63(px);
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uprv_sortArray(void *array, int32_t length, int32_t itemSize,
               UComparator *cmp, const void *context,
               UBool sortStable, UErrorCode *pErrorCode) {
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return;
    }
    if((length>0 && array==NULL) || length<0 || itemSize<=0 || cmp==NULL) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    if(length<=1) {
        return;
    } else if(length<MIN_QSORT || sortStable) {
        insertionSort((char *)array, length, itemSize, cmp, context, pErrorCode);
    } else {
        quickSort((char *)array, length, itemSize, cmp, context, pErrorCode);
    }
}